

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

uint64 __thiscall
libmatroska::KaxInternalBlock::ReadInternalHead(KaxInternalBlock *this,IOCallback *input)

{
  KaxCluster *this_00;
  uint uVar1;
  short *psVar2;
  uint64 uVar3;
  Endian<short,_(libebml::endianess)0> local_3c;
  KaxInternalBlock *pKStack_38;
  big_int16 b16;
  uint64 Result;
  binary *cursor;
  IOCallback *pIStack_20;
  binary Buffer [5];
  IOCallback *input_local;
  KaxInternalBlock *this_local;
  
  pIStack_20 = input;
  uVar1 = (*input->_vptr_IOCallback[2])(input,(long)&cursor + 3,4);
  pKStack_38 = (KaxInternalBlock *)(ulong)uVar1;
  this_local = pKStack_38;
  if (pKStack_38 == (KaxInternalBlock *)0x4) {
    Result = (long)&cursor + 4;
    this->TrackNumber = (ushort)cursor._3_1_;
    if ((this->TrackNumber & 0x80) == 0) {
      if ((this->TrackNumber & 0x40) == 0) {
        return 4;
      }
      uVar1 = (*pIStack_20->_vptr_IOCallback[2])(pIStack_20,(long)&cursor + 7,1);
      pKStack_38 = (KaxInternalBlock *)
                   ((long)&(pKStack_38->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement +
                   (ulong)uVar1);
      this->TrackNumber = (this->TrackNumber & 0x3f) << 8;
      Result = (long)&cursor + 5;
      this->TrackNumber = this->TrackNumber + (ushort)cursor._4_1_;
    }
    else {
      this->TrackNumber = this->TrackNumber & 0x7f;
    }
    libebml::Endian<short,_(libebml::endianess)0>::Endian(&local_3c);
    libebml::Endian<short,_(libebml::endianess)0>::Eval(&local_3c,(binary *)Result);
    if (this->ParentCluster == (KaxCluster *)0x0) {
      __assert_fail("ParentCluster != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0x1b6,"uint64 libmatroska::KaxInternalBlock::ReadInternalHead(IOCallback &)");
    }
    this_00 = this->ParentCluster;
    psVar2 = libebml::Endian::operator_cast_to_short_((Endian *)&local_3c);
    uVar3 = KaxCluster::GetBlockGlobalTimecode(this_00,*psVar2);
    this->Timecode = uVar3;
    this->bLocalTimecodeUsed = false;
    this_local = pKStack_38;
  }
  return (uint64)this_local;
}

Assistant:

uint64 KaxInternalBlock::ReadInternalHead(IOCallback & input)
{
  binary Buffer[5], *cursor = Buffer;
  uint64 Result = input.read(cursor, 4);
  if (Result != 4)
    return Result;

  // update internal values
  TrackNumber = *cursor++;
  if ((TrackNumber & 0x80) == 0) {
    // there is extra data
    if ((TrackNumber & 0x40) == 0) {
      // We don't support track numbers that large !
      return Result;
    }
    Result += input.read(&Buffer[4], 1);
    TrackNumber = (TrackNumber & 0x3F) << 8;
    TrackNumber += *cursor++;
  } else {
    TrackNumber &= 0x7F;
  }


  big_int16 b16;
  b16.Eval(cursor);
  assert(ParentCluster != NULL);
  Timecode = ParentCluster->GetBlockGlobalTimecode(int16(b16));
  bLocalTimecodeUsed = false;
  cursor += 2;

  return Result;
}